

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute(View<int,_true,_std::allocator<unsigned_long>_> *from,
              View<int,_false,_std::allocator<unsigned_long>_> *to)

{
  CoordinateOrder CVar1;
  int iVar2;
  reference piVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  runtime_error *this;
  reference piVar7;
  reference piVar8;
  int *piVar9;
  reference piVar10;
  reference piVar11;
  reference piVar12;
  void *dataPointer_;
  void *vDataPointer_;
  ulong uVar13;
  Marray<int,_std::allocator<unsigned_long>_> m;
  ToIterator itTo;
  View<int,_false,_std::allocator<unsigned_long>_> local_a8;
  Iterator<int,_false,_std::allocator<unsigned_long>_> local_60;
  
  if (from->data_ != (pointer)0x0) {
    if (to->data_ == (pointer)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_00228272;
    }
    if ((from->geometry_).dimension_ == (to->geometry_).dimension_) {
      if (from->data_ != (pointer)0x0) {
        uVar13 = 0;
        do {
          if ((from->geometry_).dimension_ <= uVar13) {
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(from);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            piVar10 = from->data_;
            if ((piVar10 != (reference)0x0) && (piVar3 = to->data_, piVar3 != (reference)0x0)) {
              piVar7 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                                 (from,(from->geometry_).size_ - 1);
              piVar8 = View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                 (to,(to->geometry_).size_ - 1);
              if (((piVar10 <= piVar3) && (piVar3 <= piVar7)) ||
                 ((piVar3 <= piVar10 && (piVar10 <= piVar8)))) {
                Marray<int,std::allocator<unsigned_long>>::
                Marray<int,true,std::allocator<unsigned_long>>
                          ((Marray<int,std::allocator<unsigned_long>> *)&local_a8,from);
                execute(&local_a8,to);
                operator_delete((void *)CONCAT44(local_a8.data_._4_4_,local_a8.data_._0_4_),
                                local_a8.geometry_.size_ << 2);
                uVar13 = local_a8.geometry_.dimension_ * 0x18;
                goto LAB_00227e39;
              }
            }
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(from);
            CVar1 = (from->geometry_).coordinateOrder_;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
            if (((CVar1 == (to->geometry_).coordinateOrder_) &&
                (View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(from),
                (from->geometry_).isSimple_ == true)) &&
               (View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to),
               (to->geometry_).isSimple_ == true)) {
              memcpy(to->data_,from->data_,(from->geometry_).size_ << 2);
              return;
            }
            if (from->data_ != (pointer)0x0) {
              switch((from->geometry_).dimension_) {
              case 1:
                local_a8.data_._0_4_ = 0;
                piVar8 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8);
                local_a8.data_._0_4_ = 0;
                piVar9 = AccessOperatorHelper<true>::
                         execute<int,int,true,std::allocator<unsigned_long>>(from,(int *)&local_a8);
                sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
                if (sVar5 != 0) {
                  uVar13 = 0;
                  do {
                    *piVar8 = *piVar9;
                    sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::strides(to,0);
                    piVar8 = piVar8 + sVar5;
                    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::strides(from,0);
                    piVar9 = piVar9 + sVar5;
                    uVar13 = uVar13 + 1;
                    sVar5 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
                  } while (uVar13 < sVar5);
                }
                View<int,_false,_std::allocator<unsigned_long>_>::shape(to,0);
                View<int,_false,_std::allocator<unsigned_long>_>::strides(to,0);
                View<int,_true,_std::allocator<unsigned_long>_>::shape(from,0);
                View<int,_true,_std::allocator<unsigned_long>_>::strides(from,0);
                break;
              case 2:
                local_a8.data_._0_4_ = 0;
                piVar8 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8);
                local_a8.data_._0_4_ = 0;
                piVar10 = AccessOperatorHelper<true>::
                          execute<int,int,true,std::allocator<unsigned_long>>(from,(int *)&local_a8)
                ;
                OperateHelperBinary<(unsigned_short)2,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,piVar8,piVar10);
                break;
              case 3:
                local_a8.data_._0_4_ = 0;
                piVar8 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8);
                local_a8.data_._0_4_ = 0;
                piVar10 = AccessOperatorHelper<true>::
                          execute<int,int,true,std::allocator<unsigned_long>>(from,(int *)&local_a8)
                ;
                OperateHelperBinary<(unsigned_short)3,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,piVar8,piVar10);
                break;
              case 4:
                local_a8.data_._0_4_ = 0;
                piVar8 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8);
                local_a8.data_._0_4_ = 0;
                piVar10 = AccessOperatorHelper<true>::
                          execute<int,int,true,std::allocator<unsigned_long>>(from,(int *)&local_a8)
                ;
                OperateHelperBinary<(unsigned_short)4,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,piVar8,piVar10);
                break;
              case 5:
                local_a8.data_._0_4_ = 0;
                piVar8 = AccessOperatorHelper<true>::
                         execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8);
                local_a8.data_._0_4_ = 0;
                piVar10 = AccessOperatorHelper<true>::
                          execute<int,int,true,std::allocator<unsigned_long>>(from,(int *)&local_a8)
                ;
                OperateHelperBinary<(unsigned_short)5,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                ::operate(to,from,piVar8,piVar10);
                break;
              default:
                sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                if (sVar5 == 6) {
                  local_a8.data_._0_4_ = 0;
                  piVar8 = AccessOperatorHelper<true>::
                           execute<int,int,false,std::allocator<unsigned_long>>(to,(int *)&local_a8)
                  ;
                  local_a8.data_._0_4_ = 0;
                  piVar10 = AccessOperatorHelper<true>::
                            execute<int,int,true,std::allocator<unsigned_long>>
                                      (from,(int *)&local_a8);
                  OperateHelperBinary<(unsigned_short)6,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::operate(to,from,piVar8,piVar10);
                }
                else {
                  sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                  if (sVar5 == 7) {
                    local_a8.data_._0_4_ = 0;
                    piVar8 = AccessOperatorHelper<true>::
                             execute<int,int,false,std::allocator<unsigned_long>>
                                       (to,(int *)&local_a8);
                    local_a8.data_._0_4_ = 0;
                    piVar10 = AccessOperatorHelper<true>::
                              execute<int,int,true,std::allocator<unsigned_long>>
                                        (from,(int *)&local_a8);
                    OperateHelperBinary<(unsigned_short)7,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::operate(to,from,piVar8,piVar10);
                  }
                  else {
                    sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                    if (sVar5 == 8) {
                      local_a8.data_._0_4_ = 0;
                      piVar8 = AccessOperatorHelper<true>::
                               execute<int,int,false,std::allocator<unsigned_long>>
                                         (to,(int *)&local_a8);
                      local_a8.data_._0_4_ = 0;
                      piVar10 = AccessOperatorHelper<true>::
                                execute<int,int,true,std::allocator<unsigned_long>>
                                          (from,(int *)&local_a8);
                      OperateHelperBinary<(unsigned_short)8,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                      ::operate(to,from,piVar8,piVar10);
                    }
                    else {
                      sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                      if (sVar5 == 9) {
                        local_a8.data_._0_4_ = 0;
                        piVar8 = AccessOperatorHelper<true>::
                                 execute<int,int,false,std::allocator<unsigned_long>>
                                           (to,(int *)&local_a8);
                        local_a8.data_._0_4_ = 0;
                        piVar10 = AccessOperatorHelper<true>::
                                  execute<int,int,true,std::allocator<unsigned_long>>
                                            (from,(int *)&local_a8);
                        OperateHelperBinary<(unsigned_short)9,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                        ::operate(to,from,piVar8,piVar10);
                      }
                      else {
                        sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::dimension(from);
                        if (sVar5 == 10) {
                          local_a8.data_._0_4_ = 0;
                          piVar8 = AccessOperatorHelper<true>::
                                   execute<int,int,false,std::allocator<unsigned_long>>
                                             (to,(int *)&local_a8);
                          local_a8.data_._0_4_ = 0;
                          piVar10 = AccessOperatorHelper<true>::
                                    execute<int,int,true,std::allocator<unsigned_long>>
                                              (from,(int *)&local_a8);
                          OperateHelperBinary<(unsigned_short)10,_andres::marray_detail::Assign<int,_int>,_int,_int,_true,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
                          ::operate(to,from,piVar8,piVar10);
                        }
                        else {
                          View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(from);
                          Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                     &local_a8,from,0);
                          View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(to);
                          Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                                    (&local_60,to,0);
                          while (bVar4 = Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                         hasMore((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_a8), bVar4) {
                            piVar11 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                                                ((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                  *)&local_a8);
                            iVar2 = *piVar11;
                            piVar12 = Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                      operator*(&local_60);
                            *piVar12 = iVar2;
                            Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)
                                       &local_a8);
                            Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
                                      (&local_60);
                          }
                          if (local_60.coordinates_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_60.coordinates_.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_60.coordinates_.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_60.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (local_a8.geometry_.shapeStrides_ != (size_t *)0x0) {
                            uVar13 = local_a8.geometry_.dimension_ -
                                     (long)local_a8.geometry_.shapeStrides_;
                            local_a8.geometry_.shape_ = local_a8.geometry_.shapeStrides_;
LAB_00227e39:
                            operator_delete(local_a8.geometry_.shape_,uVar13);
                          }
                        }
                      }
                    }
                  }
                }
              }
              return;
            }
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_00228272;
          }
          sVar5 = View<int,_true,_std::allocator<unsigned_long>_>::shape(from,uVar13);
          sVar6 = View<int,_false,_std::allocator<unsigned_long>_>::shape(to,uVar13);
          if (sVar5 != sVar6) {
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"Assertion failed.");
            goto LAB_00228272;
          }
          uVar13 = uVar13 + 1;
        } while (from->data_ != (pointer)0x0);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Assertion failed.");
      goto LAB_00228272;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Assertion failed.");
LAB_00228272:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void execute
    (
        const View<TFrom, true, AFrom>& from,
        View<TTo, false, ATo>& to
    )
    {
        typedef typename View<TFrom, true, AFrom>::const_iterator FromIterator;
        typedef typename View<TTo, false, ATo>::iterator ToIterator;
        if(!MARRAY_NO_ARG_TEST) {
            Assert(from.data_ != 0 && from.dimension() == to.dimension());
            for(std::size_t j=0; j<from.dimension(); ++j) {
                Assert(from.shape(j) == to.shape(j));
            }
        }
        if(from.overlaps(to)) {
            Marray<TFrom, AFrom> m = from; // temporary copy
            execute(m, to);
        }
        else if(from.coordinateOrder() == to.coordinateOrder() 
                && from.isSimple() && to.isSimple()
                && IsEqual<TFrom, TTo>::type) {
            memcpy(to.data_, from.data_, (from.size())*sizeof(TFrom));
        }
        else if(from.dimension() == 1)
            OperateHelperBinary<1, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 2)
            OperateHelperBinary<2, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 3)
            OperateHelperBinary<3, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 4)
            OperateHelperBinary<4, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 5)
            OperateHelperBinary<5, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 6)
            OperateHelperBinary<6, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 7)
            OperateHelperBinary<7, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 8)
            OperateHelperBinary<8, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 9)
            OperateHelperBinary<9, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else if(from.dimension() == 10)
            OperateHelperBinary<10, Assign<TTo, TFrom>, TTo, TFrom, true, ATo, AFrom>::operate(to, from, Assign<TTo, TFrom>(), &to(0), &from(0));
        else {
            FromIterator itFrom = from.begin();
            ToIterator itTo = to.begin();
            for(; itFrom.hasMore(); ++itFrom, ++itTo) {
                *itTo = static_cast<TTo>(*itFrom);
            }
        }
    }